

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkXpansByAliases
          (Registry *this,StringArray *aAliases,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aRet,StringArray *aUnresolved)

{
  pointer pNVar1;
  Status SVar2;
  NetworkArray *__range3;
  pointer pNVar3;
  NetworkArray networks;
  NetworkArray local_38;
  
  local_38.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVar2 = GetNetworksByAliases(this,aAliases,&local_38,aUnresolved);
  pNVar1 = local_38.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar3 = local_38.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (SVar2 == kSuccess) {
    for (; pNVar3 != pNVar1; pNVar3 = pNVar3 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(aRet,&pNVar3->mXpan);
    }
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_38);
  return SVar2;
}

Assistant:

Registry::Status Registry::GetNetworkXpansByAliases(const StringArray     &aAliases,
                                                    std::vector<uint64_t> &aRet,
                                                    StringArray           &aUnresolved)
{
    NetworkArray     networks;
    Registry::Status status = GetNetworksByAliases(aAliases, networks, aUnresolved);

    if (status == Registry::Status::kSuccess)
    {
        for (const auto &nwk : networks)
        {
            aRet.push_back(nwk.mXpan);
        }
    }
    return status;
}